

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_read(mg_connection *conn,void *buf,size_t len)

{
  int iVar1;
  uint uVar2;
  ushort **ppuVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  size_t len_00;
  byte *buf_00;
  char *end;
  undefined8 local_80;
  char lenbuf [64];
  
  len_00 = 0x7fffffff;
  if (len < 0x7fffffff) {
    len_00 = len;
  }
  if (conn == (mg_connection *)0x0) {
    return 0;
  }
  if (conn->is_chunked == 0) {
    iVar1 = mg_read_inner(conn,buf,len_00);
    return iVar1;
  }
  lVar6 = 0;
  local_80 = buf;
  do {
    while( true ) {
      if (len_00 == 0) goto LAB_00119a58;
      if (2 < conn->is_chunked) {
        return 0;
      }
      if (conn->is_chunked != 1) {
        return -1;
      }
      if (conn->consumed_content == conn->content_len) break;
      uVar2 = mg_read_inner(conn,(void *)((long)local_80 + lVar6),len_00);
      if ((int)uVar2 < 1) goto LAB_001199a1;
      lVar6 = lVar6 + (ulong)uVar2;
      len_00 = len_00 - uVar2;
      if (conn->consumed_content == conn->content_len) {
        conn->content_len = conn->consumed_content + 2;
        iVar1 = mg_read_inner(conn,lenbuf,2);
        if (((iVar1 != 2) || (lenbuf[0] != '\r')) || (lenbuf[1] != '\n')) goto LAB_001199a1;
      }
    }
    end = (char *)0x0;
    for (lVar5 = 0; lVar5 != 0x3f; lVar5 = lVar5 + 1) {
      conn->content_len = conn->content_len + 1;
      buf_00 = (byte *)(lenbuf + lVar5);
      iVar1 = mg_read_inner(conn,buf_00,1);
      if (iVar1 == 1) {
        bVar7 = lenbuf[lVar5];
        if (lVar5 == 0) goto LAB_001198bd;
        if (bVar7 == 0x3b) {
          do {
            conn->content_len = conn->content_len + 1;
            iVar1 = mg_read_inner(conn,buf_00,1);
            bVar7 = *buf_00;
            if (iVar1 != 1) goto LAB_0011988d;
          } while (bVar7 != 0xd);
        }
        else {
LAB_0011988d:
          if (bVar7 != 0xd) goto LAB_001198a2;
        }
        bVar7 = 0xd;
        if (lenbuf[lVar5 + -1] == '\r') goto LAB_001198a2;
      }
      else {
        bVar7 = 0;
        lenbuf[lVar5] = '\0';
        if (lVar5 != 0) {
LAB_001198a2:
          if (((lVar5 != 1) && (bVar7 == 10)) && (bVar7 = 10, lenbuf[lVar5 + -1] == '\r')) {
            lenbuf[lVar5 + 1] = '\0';
            uVar4 = strtoul(lenbuf,&end,0x10);
            if (uVar4 != 0) goto LAB_00119905;
            conn->is_chunked = 3;
            break;
          }
        }
LAB_001198bd:
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar7 * 2 + 1) & 0x10) == 0) goto LAB_001199a1;
      }
    }
    uVar4 = 0;
LAB_00119905:
    if ((end == (char *)0x0) || (*end != '\r')) {
LAB_001199a1:
      conn->is_chunked = 2;
      return -1;
    }
    if (conn->is_chunked == 3) {
      uVar2 = 2;
      break;
    }
    conn->content_len = conn->content_len + uVar4;
  } while( true );
LAB_001199e9:
  if ((3 < (int)uVar2) || (conn->is_chunked != 3)) {
    if (conn->is_chunked == 2) {
      return -1;
    }
    conn->is_chunked = 4;
LAB_00119a58:
    return (int)lVar6;
  }
  conn->content_len = conn->content_len + 1;
  iVar1 = mg_read_inner(conn,lenbuf,1);
  if (iVar1 == 1) {
    if ((uVar2 & 0xfffffffd) == 0) {
      uVar2 = uVar2 | 1;
      if (lenbuf[0] != '\r') {
        uVar2 = 0;
      }
    }
    else {
      if (lenbuf[0] != '\n') goto LAB_00119a24;
      uVar2 = uVar2 + 1;
    }
    goto LAB_001199e9;
  }
LAB_00119a24:
  conn->is_chunked = 2;
  goto LAB_001199e9;
}

Assistant:

CIVETWEB_API int
mg_read(struct mg_connection *conn, void *buf, size_t len)
{
	if (len > INT_MAX) {
		len = INT_MAX;
	}

	if (conn == NULL) {
		return 0;
	}

	if (conn->is_chunked) {
		size_t all_read = 0;

		while (len > 0) {
			if (conn->is_chunked >= 3) {
				/* No more data left to read */
				return 0;
			}
			if (conn->is_chunked != 1) {
				/* Has error */
				return -1;
			}

			if (conn->consumed_content != conn->content_len) {
				/* copy from the current chunk */
				int read_ret = mg_read_inner(conn, (char *)buf + all_read, len);

				if (read_ret < 1) {
					/* read error */
					conn->is_chunked = 2;
					return -1;
				}

				all_read += (size_t)read_ret;
				len -= (size_t)read_ret;

				if (conn->consumed_content == conn->content_len) {
					/* Add data bytes in the current chunk have been read,
					 * so we are expecting \r\n now. */
					char x[2];
					conn->content_len += 2;
					if ((mg_read_inner(conn, x, 2) != 2) || (x[0] != '\r')
					    || (x[1] != '\n')) {
						/* Protocol violation */
						conn->is_chunked = 2;
						return -1;
					}
				}

			} else {
				/* fetch a new chunk */
				size_t i;
				char lenbuf[64];
				char *end = NULL;
				unsigned long chunkSize = 0;

				for (i = 0; i < (sizeof(lenbuf) - 1); i++) {
					conn->content_len++;
					if (mg_read_inner(conn, lenbuf + i, 1) != 1) {
						lenbuf[i] = 0;
					}
					if ((i > 0) && (lenbuf[i] == ';')) {
						// chunk extension --> skip chars until next CR
						//
						// RFC 2616, 3.6.1 Chunked Transfer Coding
						// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
						//
						// chunk          = chunk-size [ chunk-extension ] CRLF
						//                  chunk-data CRLF
						// ...
						// chunk-extension= *( ";" chunk-ext-name [ "="
						// chunk-ext-val ] )
						do
							++conn->content_len;
						while (mg_read_inner(conn, lenbuf + i, 1) == 1
						       && lenbuf[i] != '\r');
					}
					if ((i > 0) && (lenbuf[i] == '\r')
					    && (lenbuf[i - 1] != '\r')) {
						continue;
					}
					if ((i > 1) && (lenbuf[i] == '\n')
					    && (lenbuf[i - 1] == '\r')) {
						lenbuf[i + 1] = 0;
						chunkSize = strtoul(lenbuf, &end, 16);
						if (chunkSize == 0) {
							/* regular end of content */
							conn->is_chunked = 3;
						}
						break;
					}
					if (!isxdigit((unsigned char)lenbuf[i])) {
						/* illegal character for chunk length */
						conn->is_chunked = 2;
						return -1;
					}
				}
				if ((end == NULL) || (*end != '\r')) {
					/* chunksize not set correctly */
					conn->is_chunked = 2;
					return -1;
				}
				if (conn->is_chunked == 3) {
					/* try discarding trailer for keep-alive */

					// We found the last chunk (length 0) including the
					// CRLF that terminates that chunk. Now follows a possibly
					// empty trailer and a final CRLF.
					//
					// see RFC 2616, 3.6.1 Chunked Transfer Coding
					// (https://www.rfc-editor.org/rfc/rfc2616#page-25)
					//
					// Chunked-Body   = *chunk
					// 	                last-chunk
					// 	                trailer
					// 	                CRLF
					// ...
					// last-chunk     = 1*("0") [ chunk-extension ] CRLF
					// ...
					// trailer        = *(entity-header CRLF)

					int crlf_count = 2; // one CRLF already determined

					while (crlf_count < 4 && conn->is_chunked == 3) {
						++conn->content_len;
						if (mg_read_inner(conn, lenbuf, 1) == 1) {
							if ((crlf_count == 0 || crlf_count == 2)) {
								if (lenbuf[0] == '\r')
									++crlf_count;
								else
									crlf_count = 0;
							} else {
								// previous character was a CR
								// --> next character must be LF

								if (lenbuf[0] == '\n')
									++crlf_count;
								else
									conn->is_chunked = 2;
							}
						} else
							// premature end of trailer
							conn->is_chunked = 2;
					}

					if (conn->is_chunked == 2)
						return -1;
					else
						conn->is_chunked = 4;

					break;
				}

				/* append a new chunk */
				conn->content_len += (int64_t)chunkSize;
			}
		}

		return (int)all_read;
	}
	return mg_read_inner(conn, buf, len);
}